

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::emitScopeEnd(BinaryInstWriter *this,Expression *curr)

{
  bool bVar1;
  Expression *curr_local;
  BinaryInstWriter *this_local;
  
  bVar1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::empty(&this->breakStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!breakStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                  ,0xab0,"void wasm::BinaryInstWriter::emitScopeEnd(Expression *)");
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::pop_back(&this->breakStack);
  BufferWithRandomAccess::operator<<(this->o,'\v');
  if ((this->func != (Function *)0x0) && ((this->sourceMap & 1U) == 0)) {
    WasmBinaryWriter::writeDebugLocationEnd(this->parent,curr,this->func);
  }
  return;
}

Assistant:

void BinaryInstWriter::emitScopeEnd(Expression* curr) {
  assert(!breakStack.empty());
  breakStack.pop_back();
  o << int8_t(BinaryConsts::End);
  if (func && !sourceMap) {
    parent.writeDebugLocationEnd(curr, func);
  }
}